

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O2

S2Point * __thiscall
S2PaddedCell::GetEntryVertex(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  S2Point SStack_28;
  
  iVar2 = this->ij_lo_[0];
  iVar1 = this->ij_lo_[1];
  if ((this->orientation_ & 2) != 0) {
    iVar3 = 1 << (0x1eU - (char)this->level_ & 0x1f);
    iVar2 = iVar2 + iVar3;
    iVar1 = iVar1 + iVar3;
  }
  S2::FaceSiTitoXYZ(&SStack_28,(uint)((this->id_).id_ >> 0x3d),iVar2 * 2,iVar1 * 2);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&SStack_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetEntryVertex() const {
  // The curve enters at the (0,0) vertex unless the axis directions are
  // reversed, in which case it enters at the (1,1) vertex.
  unsigned int i = ij_lo_[0];
  unsigned int j = ij_lo_[1];
  if (orientation_ & kInvertMask) {
    int ij_size = S2CellId::GetSizeIJ(level_);
    i += ij_size;
    j += ij_size;
  }
  return S2::FaceSiTitoXYZ(id_.face(), 2 * i, 2 * j).Normalize();
}